

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<Minisat::SimpSolver::ElimLt>::percolateDown
          (Heap<Minisat::SimpSolver::ElimLt> *this,int i)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  piVar2 = (this->heap).data;
  lVar7 = (long)i;
  iVar1 = piVar2[lVar7];
  iVar5 = i * 2 + 1;
  iVar6 = (this->heap).sz;
  if (iVar5 < iVar6) {
    iVar12 = i * 2;
    piVar8 = (this->indices).data;
    piVar3 = ((this->lt).n_occ)->data;
    do {
      iVar11 = iVar12 + 2;
      if (iVar11 < iVar6) {
        iVar12 = piVar2[iVar11];
        iVar6 = piVar2[iVar5];
        lVar9 = (long)iVar12 * 2;
        lVar10 = (long)((int)lVar9 + 1);
        lVar7 = (long)iVar6 * 2;
        lVar4 = (long)((int)lVar7 + 1);
        if ((ulong)((long)piVar3[lVar4] * (long)piVar3[(long)iVar6 * 2]) <=
            (ulong)((long)piVar3[lVar10] * (long)piVar3[(long)iVar12 * 2])) goto LAB_0012a5e5;
      }
      else {
        lVar7 = (long)piVar2[iVar5] * 2;
        lVar4 = (long)((int)lVar7 + 1);
        iVar6 = piVar2[iVar5];
LAB_0012a5e5:
        iVar12 = iVar6;
        lVar9 = lVar7;
        lVar10 = lVar4;
        iVar11 = iVar5;
      }
      if ((ulong)((long)piVar3[iVar1 * 2 + 1] * (long)piVar3[(long)iVar1 * 2]) <=
          (ulong)((long)piVar3[lVar10] * (long)piVar3[lVar9])) break;
      piVar2[i] = iVar12;
      piVar8[iVar12] = i;
      iVar12 = iVar11 * 2;
      iVar5 = iVar11 * 2 + 1;
      iVar6 = (this->heap).sz;
      i = iVar11;
    } while (iVar5 < iVar6);
    lVar7 = (long)i;
  }
  else {
    piVar8 = (this->indices).data;
  }
  piVar2[lVar7] = iVar1;
  piVar8[iVar1] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()) {
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i] = heap[child];
            indices[heap[i]] = i;
            i = child;
        }
        heap[i] = x;
        indices[x] = i;
    }